

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_line_reporter.h
# Opt level: O2

void __thiscall bandit::detail::single_line_reporter::print_status_line(single_line_reporter *this)

{
  ostream *poVar1;
  char *pcVar2;
  
  std::operator<<(this->stm_,'\r');
  poVar1 = std::operator<<(this->stm_,"Executed ");
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)poVar1,(this->super_progress_reporter).specs_run_);
  std::operator<<(poVar1," tests.");
  if ((this->super_progress_reporter).specs_failed_ != 0) {
    poVar1 = std::operator<<(this->stm_," ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar1,(this->super_progress_reporter).specs_succeeded_);
    poVar1 = std::operator<<(poVar1," succeeded. ");
    pcVar2 = "\x1b[1;31m";
    if (this->colorizer_->colors_enabled_ == false) {
      pcVar2 = "";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar1,(this->super_progress_reporter).specs_failed_);
    poVar1 = std::operator<<(poVar1," failed.");
    pcVar2 = "\x1b[0m";
    if (this->colorizer_->colors_enabled_ == false) {
      pcVar2 = "";
    }
    std::operator<<(poVar1,pcVar2);
  }
  std::ostream::flush();
  return;
}

Assistant:

void print_status_line()
    {
      stm_ << '\r';
      stm_ << "Executed " << specs_run_ << " tests.";

      if(specs_failed_)
      {
        stm_ << " " << specs_succeeded_ << " succeeded. " << colorizer_.red() << specs_failed_ <<
          " failed." << colorizer_.reset();
      }
      stm_.flush();
    }